

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128.cpp
# Opt level: O1

void metrohash128_2(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  pauVar1 = (undefined1 (*) [16])(key + len);
  auVar11 = vpbroadcastd_avx512vl();
  auVar11 = vpmuludq_avx(auVar11,_DAT_0018bb20);
  auVar12 = vpbroadcastq_avx512vl();
  auVar11 = vpaddq_avx(auVar11,auVar12);
  auVar12 = vpaddq_avx(auVar11,_DAT_0018bb30);
  if (len < 0x20) {
    uVar6 = auVar12._0_8_;
    uVar9 = vpextrq_avx(auVar12,1);
  }
  else {
    auVar11 = vpaddq_avx(auVar11,_DAT_0018bb40);
    auVar11 = vpshufd_avx(auVar11,0x4e);
    auVar3 = vpmovzxdq_avx(ZEXT816(0xa2aa033bd6d018f5));
    auVar2 = vpmovsxdq_avx(ZEXT816(0x30bc5b2962992fc1));
    do {
      auVar13 = vpmullq_avx512vl(auVar3,*(undefined1 (*) [16])key);
      auVar12 = vpaddq_avx(auVar13,auVar12);
      auVar13 = vpmullq_avx512vl(auVar2,*(undefined1 (*) [16])((long)key + 0x10));
      key = (uint8_t *)((long)key + 0x20);
      auVar12 = vprolq_avx512vl(auVar12,0x23);
      auVar12 = vpaddq_avx(auVar12,auVar11);
      auVar11 = vpaddq_avx(auVar13,auVar11);
      auVar11 = vprolq_avx512vl(auVar11,0x23);
      auVar11 = vpaddq_avx(auVar11,auVar12);
    } while (key <= pauVar1 + -2);
    uVar6 = auVar12._0_8_;
    uVar5 = vpextrq_avx(auVar11,1);
    uVar9 = vpextrq_avx(auVar12,1);
    uVar10 = (uVar5 + uVar6) * 0xd6d018f5 + uVar9;
    uVar7 = auVar11._0_8_ ^ (uVar10 >> 0x21 | uVar10 * 0x80000000) * 0xa2aa033b;
    uVar10 = (uVar7 + uVar9) * 0xa2aa033b + uVar6;
    uVar5 = (uVar10 >> 0x21 | uVar10 * 0x80000000) * 0xd6d018f5 ^ uVar5;
    uVar10 = (uVar7 + uVar6) * 0xd6d018f5 + uVar5;
    uVar6 = (uVar10 >> 0x21 | uVar10 * 0x80000000) * 0xa2aa033b ^ uVar6;
    uVar7 = (uVar5 + uVar9) * 0xa2aa033b + uVar7;
    uVar9 = (uVar7 >> 0x21 | uVar7 * 0x80000000) * 0xd6d018f5 ^ uVar9;
  }
  if (0xf < (long)pauVar1 - (long)key) {
    uVar6 = *(long *)*(undefined1 (*) [16])key * 0x62992fc1 + uVar6;
    uVar6 = uVar6 >> 0x1d | uVar6 << 0x23;
    uVar9 = *(long *)(*(undefined1 (*) [16])key + 8) * 0x62992fc1 + uVar9;
    key = (uint8_t *)((long)key + 0x10);
    uVar10 = uVar9 >> 0x1d | uVar9 << 0x23;
    uVar9 = uVar10 * 0x30bc5b29;
    uVar5 = uVar6 * 0x12c5448f803e40e9 + uVar9;
    uVar6 = (uVar5 >> 0x1d | uVar5 << 0x23) * 0xa2aa033b ^ uVar6 * 0x30bc5b29;
    uVar5 = uVar10 * 0x9472cc564ae2c91 + uVar6;
    uVar9 = (uVar5 >> 0x1d | uVar5 << 0x23) * 0xd6d018f5 ^ uVar9;
  }
  if (7 < (long)pauVar1 - (long)key) {
    uVar6 = *(long *)*(undefined1 (*) [16])key * 0x62992fc1 + uVar6;
    key = *(undefined1 (*) [16])key + 8;
    uVar6 = uVar6 >> 0x1d | uVar6 << 0x23;
    uVar5 = uVar6 * 0x12c5448f803e40e9 + uVar9;
    uVar6 = (uVar5 >> 0x1d | uVar5 << 0x23) * 0xa2aa033b ^ uVar6 * 0x30bc5b29;
  }
  if (3 < (long)pauVar1 - (long)key) {
    uVar9 = (ulong)*(uint *)*(undefined1 (*) [16])key * 0x62992fc1 + uVar9;
    key = *(undefined1 (*) [16])key + 4;
    uVar9 = uVar9 >> 0x1d | uVar9 << 0x23;
    uVar5 = uVar9 * 0x9472cc564ae2c91 + uVar6;
    uVar9 = (uVar5 >> 0x19 | uVar5 << 0x27) * 0xd6d018f5 ^ uVar9 * 0x30bc5b29;
  }
  if (1 < (long)pauVar1 - (long)key) {
    uVar6 = (ulong)*(ushort *)*(undefined1 (*) [16])key * 0x62992fc1 + uVar6;
    key = *(undefined1 (*) [16])key + 2;
    uVar6 = uVar6 >> 0x1d | uVar6 << 0x23;
    uVar5 = uVar6 * 0x12c5448f803e40e9 + uVar9;
    uVar6 = (uVar5 >> 0x1e | uVar5 << 0x22) * 0xa2aa033b ^ uVar6 * 0x30bc5b29;
  }
  if (pauVar1 != (undefined1 (*) [16])key && -1 < (long)pauVar1 - (long)key) {
    uVar9 = (ulong)(byte)(*(undefined1 (*) [16])key)[0] * 0x62992fc1 + uVar9;
    uVar9 = uVar9 >> 0x1d | uVar9 << 0x23;
    uVar5 = uVar9 * 0x9472cc564ae2c91 + uVar6;
    uVar9 = (uVar5 >> 0x12 | uVar5 << 0x2e) * 0xd6d018f5 ^ uVar9 * 0x30bc5b29;
  }
  uVar5 = uVar6 * 0xd6d018f5 + uVar9;
  lVar8 = (uVar5 >> 0x21 | uVar5 * 0x80000000) + uVar6;
  uVar6 = uVar9 * 0xa2aa033b + lVar8;
  lVar4 = (uVar6 >> 0x21 | uVar6 * 0x80000000) + uVar9;
  uVar6 = lVar8 * 0x62992fc1 + lVar4;
  lVar8 = (uVar6 >> 0x21 | uVar6 * 0x80000000) + lVar8;
  uVar6 = lVar4 * 0x30bc5b29 + lVar8;
  *(long *)out = lVar8;
  *(ulong *)(out + 8) = (uVar6 >> 0x21 | uVar6 * 0x80000000) + lVar4;
  return;
}

Assistant:

void metrohash128_2(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xD6D018F5;
    static const uint64_t k1 = 0xA2AA033B;
    static const uint64_t k2 = 0x62992FC1;
    static const uint64_t k3 = 0x30BC5B29; 

    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(key);
    const uint8_t * const end = ptr + len;
    
    uint64_t v[4];
    
    v[0] = ((static_cast<uint64_t>(seed) - k0) * k3) + len;
    v[1] = ((static_cast<uint64_t>(seed) + k1) * k2) + len;
    
    if (len >= 32)
    {        
        v[2] = ((static_cast<uint64_t>(seed) + k0) * k2) + len;
        v[3] = ((static_cast<uint64_t>(seed) - k1) * k3) + len;

        do
        {
            v[0] += read_u64(ptr) * k0; ptr += 8; v[0] = rotate_right(v[0],29) + v[2];
            v[1] += read_u64(ptr) * k1; ptr += 8; v[1] = rotate_right(v[1],29) + v[3];
            v[2] += read_u64(ptr) * k2; ptr += 8; v[2] = rotate_right(v[2],29) + v[0];
            v[3] += read_u64(ptr) * k3; ptr += 8; v[3] = rotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 33) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 33) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 33) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 33) * k0;
    }
    
    if ((end - ptr) >= 16)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],29) * k3;
        v[1] += read_u64(ptr) * k2; ptr += 8; v[1] = rotate_right(v[1],29) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 29) * k1;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 29) * k0;
    }
    
    if ((end - ptr) >= 8)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],29) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 29) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        v[1] += read_u32(ptr) * k2; ptr += 4; v[1] = rotate_right(v[1],29) * k3;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 25) * k0;
    }
    
    if ((end - ptr) >= 2)
    {
        v[0] += read_u16(ptr) * k2; ptr += 2; v[0] = rotate_right(v[0],29) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 30) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
          v[1] += read_u8 (ptr) * k2; v[1] = rotate_right(v[1],29) * k3;
          v[1] ^= rotate_right((v[1] * k3) + v[0], 18) * k0;
    }
    
    v[0] += rotate_right((v[0] * k0) + v[1], 33);
    v[1] += rotate_right((v[1] * k1) + v[0], 33);
    v[0] += rotate_right((v[0] * k2) + v[1], 33);
    v[1] += rotate_right((v[1] * k3) + v[0], 33);

    memcpy(out, v, 16);
}